

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeNVT::moveA(FluctuatingChargeNVT *this)

{
  RealType in_RDI;
  SimInfo *this_00;
  RealType instTemp;
  RealType integralOfChidt;
  RealType chi;
  pair<double,_double> thermostat;
  RealType cmass;
  RealType cfrc;
  RealType cpos;
  RealType cvel;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  pair<double,_double> *in_stack_ffffffffffffff68;
  StuntDouble *in_stack_ffffffffffffff70;
  Snapshot *this_01;
  undefined1 in_stack_ffffffffffffff80 [16];
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)((long)in_RDI + 0x28) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    Snapshot::getElectronicThermostat(*(Snapshot **)((long)in_RDI + 0x78));
    this_00 = (SimInfo *)Thermo::getElectronicTemperature(in_stack_ffffffffffffff80._0_8_);
    local_20 = SimInfo::beginMolecule(this_00,in_stack_ffffffffffffff80._8_8_);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginFluctuatingCharge
                           ((Molecule *)this_00,in_stack_ffffffffffffff80._8_8_);
      while (local_28 != (Atom *)0x0) {
        StuntDouble::getFlucQVel(in_stack_ffffffffffffff70);
        StuntDouble::getFlucQPos(in_stack_ffffffffffffff70);
        StuntDouble::getFlucQFrc(in_stack_ffffffffffffff70);
        Atom::getChargeMass(local_28);
        StuntDouble::setFlucQVel(in_stack_ffffffffffffff80._0_8_,in_RDI);
        StuntDouble::setFlucQPos(in_stack_ffffffffffffff80._0_8_,in_RDI);
        local_28 = Molecule::nextFluctuatingCharge
                             ((Molecule *)this_00,in_stack_ffffffffffffff80._8_8_);
      }
      local_20 = SimInfo::nextMolecule(this_00,in_stack_ffffffffffffff80._8_8_);
    }
    this_01 = *(Snapshot **)((long)in_RDI + 0x78);
    std::make_pair<double&,double&>((double *)this_01,&in_stack_ffffffffffffff68->first);
    Snapshot::setElectronicThermostat(this_01,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void FluctuatingChargeNVT::moveA() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos, cfrc, cmass;

    pair<RealType, RealType> thermostat = snap->getElectronicThermostat();
    RealType chi                        = thermostat.first;
    RealType integralOfChidt            = thermostat.second;
    RealType instTemp                   = thermo.getElectronicTemperature();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cpos  = atom->getFlucQPos();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt2_ * cfrc / cmass - dt2_ * chi * cvel;
        // position whole step
        cpos += dt_ * cvel;

        atom->setFlucQVel(cvel);
        atom->setFlucQPos(cpos);
      }
    }

    chi += dt2_ * (instTemp / targetTemp_ - 1.0) /
           (tauThermostat_ * tauThermostat_);

    integralOfChidt += chi * dt2_;
    snap->setElectronicThermostat(make_pair(chi, integralOfChidt));
  }